

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O1

REF_STATUS ref_agents_new(REF_AGENTS ref_agents,REF_INT *id)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  REF_AGENT_STRUCT *pRVar4;
  int iVar5;
  REF_INT *pRVar6;
  long lVar7;
  
  if (ref_agents->blank == -1) {
    iVar1 = ref_agents->max;
    iVar5 = 5000;
    if (5000 < (int)((double)iVar1 * 1.5)) {
      iVar5 = (int)((double)iVar1 * 1.5);
    }
    ref_agents->max = iVar5 + iVar1;
    fflush(_stdout);
    if (0 < (long)ref_agents->max) {
      pRVar4 = (REF_AGENT_STRUCT *)realloc(ref_agents->agent,(long)ref_agents->max * 0x68);
      ref_agents->agent = pRVar4;
    }
    pRVar4 = ref_agents->agent;
    if (pRVar4 == (REF_AGENT_STRUCT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x7b
             ,"ref_agents_new","realloc ref_agents->agent NULL");
      uVar2 = ref_agents->max;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar2,
             (long)(int)uVar2,0x68,(long)(int)uVar2 * 0x68);
    }
    else {
      iVar5 = ref_agents->max;
      if (iVar1 < iVar5) {
        pRVar6 = &pRVar4[iVar1].next;
        lVar7 = (long)iVar5 - (long)iVar1;
        iVar3 = iVar1;
        do {
          iVar3 = iVar3 + 1;
          ((REF_AGENT_STRUCT *)(pRVar6 + -2))->mode = REF_AGENT_UNUSED;
          ((REF_AGENT_STRUCT *)(pRVar6 + -2))->previous = -1;
          *pRVar6 = iVar3;
          pRVar6 = pRVar6 + 0x1a;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      pRVar4[(long)iVar5 + -1].next = -1;
      ref_agents->blank = iVar1;
    }
    if (pRVar4 == (REF_AGENT_STRUCT *)0x0) {
      return 2;
    }
  }
  iVar1 = ref_agents->blank;
  *id = iVar1;
  pRVar4 = ref_agents->agent;
  ref_agents->blank = pRVar4[iVar1].next;
  iVar1 = ref_agents->last;
  if ((long)iVar1 != -1) {
    pRVar4[iVar1].next = *id;
  }
  pRVar4[*id].mode = REF_AGENT_NEW;
  pRVar4[*id].previous = iVar1;
  pRVar4[*id].next = -1;
  ref_agents->last = *id;
  ref_agents->n = ref_agents->n + 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_new(REF_AGENTS ref_agents, REF_INT *id) {
  if (REF_EMPTY == ref_agents->blank) {
    REF_INT orig, chunk, extra;
    orig = ref_agents->max;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_agents->max = orig + chunk;
    ref_realloc(ref_agents->agent, ref_agents->max, REF_AGENT_STRUCT);

    for (extra = orig; extra < ref_agents->max; extra++) {
      ref_agent_mode(ref_agents, extra) = REF_AGENT_UNUSED;
      ref_agent_previous(ref_agents, extra) = REF_EMPTY;
      ref_agent_next(ref_agents, extra) = extra + 1;
    }
    ref_agent_next(ref_agents, ref_agents_max(ref_agents) - 1) = REF_EMPTY;
    ref_agents->blank = orig;
  }

  *id = ref_agents->blank;
  ref_agents->blank = ref_agent_next(ref_agents, *id);

  if (REF_EMPTY != ref_agents->last)
    ref_agent_next(ref_agents, ref_agents->last) = *id;

  ref_agent_mode(ref_agents, *id) = REF_AGENT_NEW;
  ref_agent_previous(ref_agents, *id) = ref_agents->last;
  ref_agent_next(ref_agents, *id) = REF_EMPTY;

  ref_agents->last = *id;

  ref_agents_n(ref_agents)++;

  return REF_SUCCESS;
}